

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImGuiID __thiscall ImGuiWindow::GetID(ImGuiWindow *this,char *str,char *str_end)

{
  ImU32 IVar1;
  long lVar2;
  int data_size;
  
  lVar2 = (long)(this->IDStack).Size;
  if (0 < lVar2) {
    data_size = 0;
    if (str_end != (char *)0x0) {
      data_size = (int)str_end - (int)str;
    }
    IVar1 = ImHash(str,data_size,(this->IDStack).Data[lVar2 + -1]);
    if (GImGui->ActiveId == IVar1) {
      GImGui->ActiveIdIsAlive = true;
    }
    return IVar1;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                ,0x4a4,"value_type &ImVector<unsigned int>::back() [T = unsigned int]");
}

Assistant:

ImGuiID ImGuiWindow::GetID(const char* str, const char* str_end)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHash(str, str_end ? (int)(str_end - str) : 0, seed);
    ImGui::KeepAliveID(id);
    return id;
}